

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall CppUnit::Message::addDetail(Message *this,Message *message)

{
  iterator local_b8;
  const_iterator local_98;
  const_iterator local_78;
  iterator local_58;
  const_iterator local_38;
  Message *local_18;
  Message *message_local;
  Message *this_local;
  
  local_18 = message;
  message_local = this;
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(&local_58,&this->m_details);
  std::_Deque_iterator<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const*>
  ::
  _Deque_iterator<std::_Deque_iterator<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string*>,void>
            ((_Deque_iterator<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const*>
              *)&local_38,&local_58);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin(&local_78,&local_18->m_details);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::end(&local_98,&local_18->m_details);
  std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<std::_Deque_iterator<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const*>,void>
            (&local_b8,
             (deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->m_details,
             &local_38,&local_78,&local_98);
  return;
}

Assistant:

void 
Message::addDetail( const Message &message )
{
  m_details.insert( m_details.end(), 
                    message.m_details.begin(), 
                    message.m_details.end() );
}